

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_tet_quality(REF_NODE ref_node,REF_INT *nodes,REF_DBL *quality)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL *quality_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  if (ref_node->tet_quality == 1) {
    uVar1 = ref_node_tet_epic_quality(ref_node,nodes,quality);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x7a1,
             "ref_node_tet_quality",(ulong)uVar1,"epic");
      return uVar1;
    }
  }
  else {
    if (ref_node->tet_quality != 2) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x7a7,
             "ref_node_tet_quality","case not recognized");
      return 1;
    }
    uVar1 = ref_node_tet_jac_quality(ref_node,nodes,quality);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x7a4,
             "ref_node_tet_quality",(ulong)uVar1,"jac");
      return uVar1;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_tet_quality(REF_NODE ref_node, REF_INT *nodes,
                                        REF_DBL *quality) {
  switch (ref_node->tet_quality) {
    case REF_NODE_EPIC_QUALITY:
      RSS(ref_node_tet_epic_quality(ref_node, nodes, quality), "epic");
      break;
    case REF_NODE_JAC_QUALITY:
      RSS(ref_node_tet_jac_quality(ref_node, nodes, quality), "jac");
      break;
    default:
      THROW("case not recognized");
  }
  return REF_SUCCESS;
}